

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O1

void __thiscall
duckdb::WindowBoundariesState::FrameBegin
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,
          WindowInputExpression *boundary_begin,ValidityMask *order_mask,
          optional_ptr<duckdb::WindowCursor,_true> range)

{
  FrameBounds *prev;
  size_type *psVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t *piVar4;
  __node_base_ptr p_Var5;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> __ptr;
  unsigned_long *puVar6;
  _Hash_node_base *order_end;
  size_type sVar7;
  WindowCursor *pWVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  reference pvVar11;
  reference pvVar12;
  unsigned_long uVar13;
  type pWVar14;
  idx_t iVar15;
  OutOfRangeException *pOVar16;
  InternalException *this_00;
  idx_t iVar17;
  long lVar18;
  ulong uVar19;
  data_ptr_t pdVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  idx_t local_90;
  unsigned_long n;
  undefined1 local_60 [16];
  size_type local_50;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *local_48;
  idx_t *local_40;
  __node_base_ptr local_38;
  long lVar24;
  
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,0);
  psVar1 = (size_type *)pvVar11->data;
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,1);
  pdVar2 = pvVar11->data;
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
  pdVar3 = pvVar11->data;
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,4);
  piVar4 = (idx_t *)pvVar11->data;
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,5);
  p_Var5 = (__node_base_ptr)pvVar11->data;
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
  pdVar20 = pvVar11->data;
  local_50 = *psVar1;
  (this->prev).start = *piVar4;
  (this->prev).end = (idx_t)p_Var5->_M_nxt;
  local_40 = piVar4;
  local_38 = p_Var5;
  if (((this->has_preceding_range != false) || (this->has_following_range == true)) &&
     ((this->range_lo).ptr != range.ptr)) {
    (this->range_lo).ptr = range.ptr;
    optional_ptr<duckdb::WindowCursor,_true>::CheckValid(&this->range_lo);
    WindowCursor::Copy((WindowCursor *)&n);
    uVar13 = n;
    n = 0;
    __ptr._M_head_impl =
         (this->range_hi).
         super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
         super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
         super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
    (this->range_hi).
    super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
    super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)uVar13;
    if (__ptr._M_head_impl != (WindowCursor *)0x0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)&this->range_hi,__ptr._M_head_impl);
    }
    if (n != 0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)&n,(WindowCursor *)n);
    }
  }
  auVar9 = _DAT_01356200;
  if (this->start_boundary < (EXPR_FOLLOWING_RANGE|CURRENT_ROW_ROWS)) {
    prev = &this->prev;
    switch(this->start_boundary) {
    default:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      n = (unsigned_long)local_60;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&n,"Unsupported window start boundary","");
      InternalException::InternalException(this_00,(string *)&n);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case UNBOUNDED_PRECEDING:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
      pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,0);
      Vector::Reference(pvVar11,pvVar12);
      return;
    case CURRENT_ROW_RANGE:
    case CURRENT_ROW_GROUPS:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
      pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
      Vector::Reference(pvVar11,pvVar12);
      pdVar20 = pdVar3;
      break;
    case CURRENT_ROW_ROWS:
      if (count != 0) {
        lVar18 = count - 1;
        auVar22._8_4_ = (int)lVar18;
        auVar22._0_8_ = lVar18;
        auVar22._12_4_ = (int)((ulong)lVar18 >> 0x20);
        lVar18 = 1;
        auVar22 = auVar22 ^ _DAT_01356200;
        auVar23 = _DAT_0135e310;
        local_90 = row_idx;
        do {
          auVar25 = auVar23 ^ auVar9;
          if ((bool)(~(auVar25._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar25._0_4_ ||
                      auVar22._4_4_ < auVar25._4_4_) & 1)) {
            *(idx_t *)(pdVar20 + lVar18 * 8 + -8) = local_90;
          }
          if ((auVar25._12_4_ != auVar22._12_4_ || auVar25._8_4_ <= auVar22._8_4_) &&
              auVar25._12_4_ <= auVar22._12_4_) {
            *(idx_t *)(pdVar20 + lVar18 * 8) = local_90 + 1;
          }
          lVar24 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 2;
          auVar23._8_8_ = lVar24 + 2;
          lVar24 = lVar18 - (count + 1 & 0xfffffffffffffffe);
          lVar18 = lVar18 + 2;
          local_90 = local_90 + 2;
        } while (lVar24 != -1);
      }
      break;
    case EXPR_PRECEDING_ROWS:
      if (count != 0) {
        iVar15 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_begin->chunk->data,boundary_begin->col_idx);
          iVar17 = 0;
          if (boundary_begin->scalar == false) {
            iVar17 = iVar15;
          }
          bVar10 = TrySubtractOperator::Operation<long,long,long>
                             (row_idx + iVar15,*(int64_t *)(pvVar11->data + iVar17 * 8),
                              (int64_t *)&n);
          if (bVar10) {
            uVar13 = n;
            if ((long)n < 1) {
              uVar13 = 0;
            }
          }
          else {
            uVar13 = psVar1[iVar15];
          }
          *(unsigned_long *)(pdVar20 + iVar15 * 8) = uVar13;
          iVar15 = iVar15 + 1;
        } while (count != iVar15);
      }
      break;
    case EXPR_FOLLOWING_ROWS:
      if (count != 0) {
        iVar15 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_begin->chunk->data,boundary_begin->col_idx);
          iVar17 = 0;
          if (boundary_begin->scalar == false) {
            iVar17 = iVar15;
          }
          bVar10 = TryAddOperator::Operation<long,long,long>
                             (row_idx + iVar15,*(int64_t *)(pvVar11->data + iVar17 * 8),
                              (int64_t *)&n);
          if (bVar10) {
            uVar13 = n;
            if ((long)n < 1) {
              uVar13 = 0;
            }
          }
          else {
            uVar13 = psVar1[iVar15];
          }
          *(unsigned_long *)(pdVar20 + iVar15 * 8) = uVar13;
          iVar15 = iVar15 + 1;
        } while (count != iVar15);
      }
      break;
    case EXPR_PRECEDING_RANGE:
      if (count != 0) {
        local_48 = &this->range_hi;
        uVar21 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_begin->chunk->data,boundary_begin->col_idx);
          puVar6 = (pvVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (boundary_begin->scalar == true) {
            if (puVar6 == (unsigned_long *)0x0) goto LAB_00ccfd78;
            uVar19 = (ulong)((uint)*puVar6 & 1);
LAB_00ccfd6f:
            if (uVar19 != 0) goto LAB_00ccfd78;
            iVar15 = *(idx_t *)(pdVar3 + uVar21 * 8);
          }
          else {
            if (puVar6 != (unsigned_long *)0x0) {
              uVar19 = 1L << ((byte)uVar21 & 0x3f) & puVar6[uVar21 >> 6];
              goto LAB_00ccfd6f;
            }
LAB_00ccfd78:
            iVar15 = local_40[uVar21];
            (this->prev).end = (idx_t)local_38[uVar21]._M_nxt;
            sVar7 = psVar1[uVar21];
            if (sVar7 != local_50) {
              prev->start = iVar15;
              local_50 = sVar7;
            }
            optional_ptr<duckdb::WindowCursor,_true>::CheckValid(&this->range_lo);
            pWVar8 = (this->range_lo).ptr;
            pWVar14 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                      ::operator*(local_48);
            iVar15 = FindOrderedRangeBound<true>
                               (pWVar8,pWVar14,this->range_sense,iVar15,row_idx + 1 + uVar21,
                                this->start_boundary,boundary_begin,uVar21,prev);
            (this->prev).start = iVar15;
          }
          *(idx_t *)(pdVar20 + uVar21 * 8) = iVar15;
          uVar21 = uVar21 + 1;
        } while (count != uVar21);
      }
      break;
    case EXPR_FOLLOWING_RANGE:
      if (count != 0) {
        local_48 = &this->range_hi;
        uVar21 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_begin->chunk->data,boundary_begin->col_idx);
          puVar6 = (pvVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (boundary_begin->scalar == true) {
            if (puVar6 == (unsigned_long *)0x0) goto LAB_00ccff58;
            uVar19 = (ulong)((uint)*puVar6 & 1);
LAB_00ccff4f:
            if (uVar19 != 0) goto LAB_00ccff58;
            iVar15 = *(idx_t *)(pdVar3 + uVar21 * 8);
          }
          else {
            if (puVar6 != (unsigned_long *)0x0) {
              uVar19 = 1L << ((byte)uVar21 & 0x3f) & puVar6[uVar21 >> 6];
              goto LAB_00ccff4f;
            }
LAB_00ccff58:
            order_end = local_38[uVar21]._M_nxt;
            (this->prev).end = (idx_t)order_end;
            sVar7 = psVar1[uVar21];
            if (sVar7 != local_50) {
              prev->start = local_40[uVar21];
              local_50 = sVar7;
            }
            optional_ptr<duckdb::WindowCursor,_true>::CheckValid(&this->range_lo);
            pWVar8 = (this->range_lo).ptr;
            pWVar14 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                      ::operator*(local_48);
            iVar15 = FindOrderedRangeBound<true>
                               (pWVar8,pWVar14,this->range_sense,row_idx + uVar21,(idx_t)order_end,
                                this->start_boundary,boundary_begin,uVar21,prev);
            (this->prev).start = iVar15;
          }
          *(idx_t *)(pdVar20 + uVar21 * 8) = iVar15;
          uVar21 = uVar21 + 1;
        } while (count != uVar21);
      }
      break;
    case EXPR_PRECEDING_GROUPS:
      if (count != 0) {
        uVar21 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_begin->chunk->data,boundary_begin->col_idx);
          puVar6 = (pvVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (boundary_begin->scalar == true) {
            if (puVar6 == (unsigned_long *)0x0) goto LAB_00ccfb1a;
            uVar19 = (ulong)((uint)*puVar6 & 1);
LAB_00ccfb15:
            if (uVar19 != 0) goto LAB_00ccfb1a;
            iVar15 = *(idx_t *)(pdVar3 + uVar21 * 8);
          }
          else {
            if (puVar6 != (unsigned_long *)0x0) {
              uVar19 = 1L << ((byte)uVar21 & 0x3f) & puVar6[uVar21 >> 6];
              goto LAB_00ccfb15;
            }
LAB_00ccfb1a:
            iVar15 = *(idx_t *)(pdVar3 + uVar21 * 8);
            iVar17 = psVar1[uVar21];
            pvVar11 = vector<duckdb::Vector,_true>::operator[]
                                (&boundary_begin->chunk->data,boundary_begin->col_idx);
            uVar19 = 0;
            if (boundary_begin->scalar == false) {
              uVar19 = uVar21;
            }
            uVar13 = *(unsigned_long *)(pvVar11->data + uVar19 * 8);
            if ((long)uVar13 < 0) {
              pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
              n = (unsigned_long)local_60;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&n,"Invalid GROUPS PRECEDING value","");
              OutOfRangeException::OutOfRangeException(pOVar16,(string *)&n);
              __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            if (uVar13 != 0) {
              n = uVar13;
              iVar15 = FindPrevStart(order_mask,iVar17,iVar15,&n);
            }
          }
          *(idx_t *)(pdVar20 + uVar21 * 8) = iVar15;
          uVar21 = uVar21 + 1;
        } while (count != uVar21);
      }
      break;
    case EXPR_FOLLOWING_GROUPS:
      if (count != 0) {
        uVar21 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_begin->chunk->data,boundary_begin->col_idx);
          puVar6 = (pvVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (boundary_begin->scalar == true) {
            if (puVar6 == (unsigned_long *)0x0) goto LAB_00ccfc6c;
            uVar19 = (ulong)((uint)*puVar6 & 1);
LAB_00ccfc67:
            if (uVar19 != 0) goto LAB_00ccfc6c;
            iVar15 = *(idx_t *)(pdVar3 + uVar21 * 8);
          }
          else {
            if (puVar6 != (unsigned_long *)0x0) {
              uVar19 = 1L << ((byte)uVar21 & 0x3f) & puVar6[uVar21 >> 6];
              goto LAB_00ccfc67;
            }
LAB_00ccfc6c:
            iVar15 = *(idx_t *)(pdVar3 + uVar21 * 8);
            iVar17 = *(idx_t *)(pdVar2 + uVar21 * 8);
            pvVar11 = vector<duckdb::Vector,_true>::operator[]
                                (&boundary_begin->chunk->data,boundary_begin->col_idx);
            uVar19 = 0;
            if (boundary_begin->scalar == false) {
              uVar19 = uVar21;
            }
            uVar13 = *(unsigned_long *)(pvVar11->data + uVar19 * 8);
            if ((long)uVar13 < 0) {
              pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
              n = (unsigned_long)local_60;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&n,"Invalid GROUPS FOLLOWING value","");
              OutOfRangeException::OutOfRangeException(pOVar16,(string *)&n);
              __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            if (uVar13 != 0) {
              n = uVar13;
              iVar15 = FindNextStart(order_mask,iVar15 + 1,iVar17,&n);
            }
          }
          *(idx_t *)(pdVar20 + uVar21 * 8) = iVar15;
          uVar21 = uVar21 + 1;
        } while (count != uVar21);
      }
    }
  }
  if (count != 0) {
    iVar15 = 0;
    do {
      uVar21 = psVar1[iVar15];
      if (psVar1[iVar15] < *(ulong *)(pdVar20 + iVar15 * 8)) {
        uVar21 = *(ulong *)(pdVar20 + iVar15 * 8);
      }
      uVar19 = *(ulong *)(pdVar2 + iVar15 * 8);
      if (uVar19 <= uVar21) {
        uVar21 = uVar19;
      }
      *(ulong *)(pdVar20 + iVar15 * 8) = uVar21;
      iVar15 = iVar15 + 1;
    } while (count != iVar15);
  }
  return;
}

Assistant:

void WindowBoundariesState::FrameBegin(DataChunk &bounds, idx_t row_idx, const idx_t count,
                                       WindowInputExpression &boundary_begin, const ValidityMask &order_mask,
                                       optional_ptr<WindowCursor> range) {
	auto partition_begin_data = FlatVector::GetData<idx_t>(bounds.data[PARTITION_BEGIN]);
	auto partition_end_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_END]);
	auto peer_begin_data = FlatVector::GetData<idx_t>(bounds.data[PEER_BEGIN]);
	auto valid_begin_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_BEGIN]);
	auto valid_end_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_END]);
	auto frame_begin_data = FlatVector::GetData<idx_t>(bounds.data[FRAME_BEGIN]);

	idx_t window_start = NumericLimits<idx_t>::Maximum();

	//	Reset previous range hints
	idx_t prev_partition = partition_begin_data[0];
	prev.start = valid_begin_data[0];
	prev.end = valid_end_data[0];

	if (has_preceding_range || has_following_range) {
		if (range_lo.get() != range.get()) {
			range_lo = range.get();
			range_hi = range_lo->Copy();
		}
	}

	switch (start_boundary) {
	case WindowBoundary::UNBOUNDED_PRECEDING:
		bounds.data[FRAME_BEGIN].Reference(bounds.data[PARTITION_BEGIN]);
		// No need to clamp
		return;
	case WindowBoundary::CURRENT_ROW_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			frame_begin_data[chunk_idx] = row_idx;
		}
		break;
	case WindowBoundary::CURRENT_ROW_RANGE:
	case WindowBoundary::CURRENT_ROW_GROUPS:
		// in RANGE or GROUPS mode it means that the frame starts or ends with the current row's
		// first or last peer in the ORDER BY ordering
		bounds.data[FRAME_BEGIN].Reference(bounds.data[PEER_BEGIN]);
		frame_begin_data = peer_begin_data;
		break;
	case WindowBoundary::EXPR_PRECEDING_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TrySubtractOperator::Operation(static_cast<int64_t>(row_idx),
			                                    boundary_begin.GetCell<int64_t>(chunk_idx), computed_start)) {
				window_start = partition_begin_data[chunk_idx];
			} else {
				window_start = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TryAddOperator::Operation(static_cast<int64_t>(row_idx), boundary_begin.GetCell<int64_t>(chunk_idx),
			                               computed_start)) {
				window_start = partition_begin_data[chunk_idx];
			} else {
				window_start = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				const auto valid_start = valid_begin_data[chunk_idx];
				prev.end = valid_end_data[chunk_idx];
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.start = valid_start;
					prev_partition = cur_partition;
				}
				window_start = FindOrderedRangeBound<true>(*range_lo, *range_hi, range_sense, valid_start, row_idx + 1,
				                                           start_boundary, boundary_begin, chunk_idx, prev);
				prev.start = window_start;
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				const auto valid_end = valid_end_data[chunk_idx];
				prev.end = valid_end;
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.start = valid_begin_data[chunk_idx];
					prev_partition = cur_partition;
				}
				window_start = FindOrderedRangeBound<true>(*range_lo, *range_hi, range_sense, row_idx, valid_end,
				                                           start_boundary, boundary_begin, chunk_idx, prev);
				prev.start = window_start;
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_GROUPS:
		// In GROUPS mode, the offset is an integer indicating that the frame starts or ends that many peer groups
		// before or after the current row's peer group, where a peer group is a group of rows that are equivalent
		// according to the window's ORDER BY clause.
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				//	Count peer groups backwards.
				const auto peer_begin = peer_begin_data[chunk_idx];
				const auto partition_begin = partition_begin_data[chunk_idx];
				const auto boundary = boundary_begin.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS PRECEDING value");
				} else if (!boundary) {
					window_start = peer_begin;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_start = FindPrevStart(order_mask, partition_begin, peer_begin, n);
				}
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_GROUPS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				//	Count peer groups forward.
				const auto peer_begin = peer_begin_data[chunk_idx];
				const auto partition_end = partition_end_data[chunk_idx];
				const auto boundary = boundary_begin.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS FOLLOWING value");
				} else if (!boundary) {
					window_start = peer_begin;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_start = FindNextStart(order_mask, peer_begin + 1, partition_end, n);
				}
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::UNBOUNDED_FOLLOWING:
	case WindowBoundary::INVALID:
		throw InternalException("Unsupported window start boundary");
	}

	ClampFrame(count, frame_begin_data, partition_begin_data, partition_end_data);
}